

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O3

void __thiscall
LinkedObjectFile::append_word_to_string(LinkedObjectFile *this,string *dest,LinkedWord *word)

{
  ushort uVar1;
  pointer pLVar2;
  ulong uVar3;
  runtime_error *this_00;
  _Alloc_hider _Var4;
  ulong uVar5;
  char *pcVar6;
  char buff [128];
  char local_98 [136];
  
  switch(word->kind) {
  case PLAIN_DATA:
    sprintf(local_98,"    .word 0x%x\n",(ulong)word->data);
    goto LAB_0012e0b8;
  case PTR:
    uVar5 = (ulong)word->label_id;
    pLVar2 = (this->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = ((long)(this->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pLVar2 >> 3) * -0x3333333333333333;
    if (uVar3 < uVar5 || uVar3 - uVar5 == 0) {
LAB_0012e113:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar5,
                 uVar3);
    }
    _Var4._M_p = pLVar2[uVar5].name._M_dataplus._M_p;
    pcVar6 = "    .word %s\n";
    break;
  case HI_PTR:
    uVar5 = (ulong)word->label_id;
    pLVar2 = (this->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = ((long)(this->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pLVar2 >> 3) * -0x3333333333333333;
    if (uVar3 < uVar5 || uVar3 - uVar5 == 0) goto LAB_0012e113;
    uVar1 = *(ushort *)((long)&word->data + 2);
    _Var4._M_p = pLVar2[uVar5].name._M_dataplus._M_p;
    pcVar6 = "    .ptr-hi 0x%x %s\n";
    goto LAB_0012e0b1;
  case LO_PTR:
    uVar5 = (ulong)word->label_id;
    pLVar2 = (this->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = ((long)(this->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pLVar2 >> 3) * -0x3333333333333333;
    if (uVar3 < uVar5 || uVar3 - uVar5 == 0) goto LAB_0012e113;
    uVar1 = *(ushort *)((long)&word->data + 2);
    _Var4._M_p = pLVar2[uVar5].name._M_dataplus._M_p;
    pcVar6 = "    .ptr-lo 0x%x %s\n";
    goto LAB_0012e0b1;
  case SYM_PTR:
    _Var4._M_p = (word->symbol_name)._M_dataplus._M_p;
    pcVar6 = "    .symbol %s\n";
    break;
  case EMPTY_PTR:
    builtin_strncpy(local_98,"    .empty-list\n",0x11);
    goto LAB_0012e0b8;
  case SYM_OFFSET:
    uVar1 = *(ushort *)((long)&word->data + 2);
    _Var4._M_p = (word->symbol_name)._M_dataplus._M_p;
    pcVar6 = "    .sym-off 0x%x %s\n";
LAB_0012e0b1:
    sprintf(local_98,pcVar6,(ulong)uVar1,_Var4._M_p);
    goto LAB_0012e0b8;
  case TYPE_PTR:
    _Var4._M_p = (word->symbol_name)._M_dataplus._M_p;
    pcVar6 = "    .type %s\n";
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"nyi");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sprintf(local_98,pcVar6,_Var4._M_p);
LAB_0012e0b8:
  std::__cxx11::string::append((char *)dest);
  return;
}

Assistant:

void LinkedObjectFile::append_word_to_string(std::string& dest, const LinkedWord& word) const {
  char buff[128];

  switch (word.kind) {
    case LinkedWord::PLAIN_DATA:
      sprintf(buff, "    .word 0x%x\n", word.data);
      break;
    case LinkedWord::PTR:
      sprintf(buff, "    .word %s\n", labels.at(word.label_id).name.c_str());
      break;
    case LinkedWord::SYM_PTR:
      sprintf(buff, "    .symbol %s\n", word.symbol_name.c_str());
      break;
    case LinkedWord::TYPE_PTR:
      sprintf(buff, "    .type %s\n", word.symbol_name.c_str());
      break;
    case LinkedWord::EMPTY_PTR:
      sprintf(buff, "    .empty-list\n");  // ?
      break;
    case LinkedWord::HI_PTR:
      sprintf(buff, "    .ptr-hi 0x%x %s\n", word.data >> 16,
              labels.at(word.label_id).name.c_str());
      break;
    case LinkedWord::LO_PTR:
      sprintf(buff, "    .ptr-lo 0x%x %s\n", word.data >> 16,
              labels.at(word.label_id).name.c_str());
      break;
    case LinkedWord::SYM_OFFSET:
      sprintf(buff, "    .sym-off 0x%x %s\n", word.data >> 16, word.symbol_name.c_str());
      break;
    default:
      throw std::runtime_error("nyi");
  }

  dest += buff;
}